

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O2

void Imf_3_2::loadFlatScanLineImage(string *fileName,Header *hdr,FlatImage *img)

{
  char *pcVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  undefined8 uVar5;
  FlatImageLevel *this;
  iterator iVar6;
  Iterator IVar7;
  InputFile in;
  FrameBuffer fb;
  undefined1 auStack_a8 [16];
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_98;
  string local_68;
  undefined4 extraout_var;
  
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)auStack_a8,pcVar1,iVar2);
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::channels();
  Image::clearChannels(&img->super_Image);
  p_Var3 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  while( true ) {
    p_Var4 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var3 == p_Var4) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,(char *)(p_Var3 + 1),(allocator<char> *)&local_98);
    Image::insertChannel(&img->super_Image,&local_68,(Channel *)(p_Var3 + 9));
    std::__cxx11::string::~string((string *)&local_68);
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  Imf_3_2::InputFile::header();
  uVar5 = Imf_3_2::Header::dataWindow();
  (*(img->super_Image)._vptr_Image[2])(img,uVar5,0,0);
  iVar2 = (*(img->super_Image)._vptr_Image[3])(img,0);
  this = (FlatImageLevel *)CONCAT44(extraout_var,iVar2);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar6._M_node = (_Base_ptr)FlatImageLevel::begin(this);
  while( true ) {
    IVar7 = FlatImageLevel::end(this);
    if ((iterator)iVar6._M_node == IVar7._i._M_node) break;
    (**(code **)(**(long **)(iVar6._M_node + 2) + 0x20))(&local_68);
    Imf_3_2::FrameBuffer::insert((string *)&local_98,(Slice *)(iVar6._M_node + 1));
    iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node);
  }
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)auStack_a8);
  Imf_3_2::InputFile::readPixels((int)auStack_a8,(this->super_ImageLevel)._dataWindow.min.y);
  Imf_3_2::InputFile::header();
  p_Var3 = (_Rb_tree_node_base *)Imf_3_2::Header::begin();
  while( true ) {
    Imf_3_2::InputFile::header();
    p_Var4 = (_Rb_tree_node_base *)Imf_3_2::Header::end();
    if (p_Var3 == p_Var4) break;
    iVar2 = strcmp((char *)(p_Var3 + 1),"tiles");
    if (iVar2 != 0) {
      Imf_3_2::Header::insert((char *)hdr,(Attribute *)(p_Var3 + 1));
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_98);
  Imf_3_2::InputFile::~InputFile((InputFile *)auStack_a8);
  return;
}

Assistant:

void
loadFlatScanLineImage (const string& fileName, Header& hdr, FlatImage& img)
{
    InputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (in.header ().dataWindow (), ONE_LEVEL, ROUND_DOWN);

    FlatImageLevel& level = img.level ();
    FrameBuffer     fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);
    in.readPixels (level.dataWindow ().min.y, level.dataWindow ().max.y);

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        if (strcmp (i.name (), "tiles")) hdr.insert (i.name (), i.attribute ());
    }
}